

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O3

char * conf_get_str_nthstrkey(Conf *conf,int primary,int n)

{
  int *piVar1;
  int index;
  constkey key;
  int local_2c;
  int local_28 [2];
  char *local_20;
  
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x16e,"char *conf_get_str_nthstrkey(Conf *, int, int)");
  }
  if (valuetypes[primary] == 3) {
    local_20 = "";
    local_28[0] = primary;
    piVar1 = (int *)findrelpos234(conf->tree,local_28,conf_cmp_constkey,4,&local_2c);
    if ((((piVar1 != (int *)0x0) && (*piVar1 == primary)) &&
        (piVar1 = (int *)index234(conf->tree,n + local_2c), piVar1 != (int *)0x0)) &&
       (*piVar1 == primary)) {
      return *(char **)(piVar1 + 2);
    }
    return (char *)0x0;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x16f,"char *conf_get_str_nthstrkey(Conf *, int, int)");
}

Assistant:

char *conf_get_str_nthstrkey(Conf *conf, int primary, int n)
{
    struct constkey key;
    struct conf_entry *entry;
    int index;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = "";
    entry = findrelpos234(conf->tree, &key, conf_cmp_constkey,
                          REL234_GE, &index);
    if (!entry || entry->key.primary != primary)
        return NULL;
    entry = index234(conf->tree, index + n);
    if (!entry || entry->key.primary != primary)
        return NULL;
    return entry->key.secondary.s;
}